

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ogl_shader.c
# Opt level: O2

_Bool glsl_build_shader(ALLEGRO_SHADER *shader)

{
  GLuint GVar1;
  _Bool _Var2;
  GLuint GVar3;
  GLint GVar4;
  ALLEGRO_SHADER_PLATFORM AVar5;
  ALLEGRO_USTR *pAVar6;
  ulong uVar7;
  GLint status;
  GLchar error_buf [4096];
  
  if ((*(int *)&shader[1].vertex_copy != 0) || (*(int *)((long)&shader[1].vertex_copy + 4) != 0)) {
    if (*(GLuint *)&shader[1].pixel_copy != 0) {
      (*_al_glDeleteProgram)(*(GLuint *)&shader[1].pixel_copy);
    }
    GVar3 = (*_al_glCreateProgram)();
    *(GLuint *)&shader[1].pixel_copy = GVar3;
    if (GVar3 != 0) {
      if (*(GLuint *)&shader[1].vertex_copy != 0) {
        (*_al_glAttachShader)(GVar3,*(GLuint *)&shader[1].vertex_copy);
        GVar3 = *(GLuint *)&shader[1].pixel_copy;
      }
      GVar1 = *(GLuint *)((long)&shader[1].vertex_copy + 4);
      if (GVar1 != 0) {
        (*_al_glAttachShader)(GVar3,GVar1);
        GVar3 = *(GLuint *)&shader[1].pixel_copy;
      }
      (*_al_glLinkProgram)(GVar3);
      (*_al_glGetProgramiv)(*(GLuint *)&shader[1].pixel_copy,0x8b82,&status);
      GVar3 = *(GLuint *)&shader[1].pixel_copy;
      if (status != 0) {
        GVar4 = (*_al_glGetAttribLocation)(GVar3,"al_pos");
        *(GLint *)((long)&shader[1].pixel_copy + 4) = GVar4;
        GVar4 = (*_al_glGetAttribLocation)(GVar3,"al_color");
        *(GLint *)&shader[1].log = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_projview_matrix");
        *(GLint *)((long)&shader[1].log + 4) = GVar4;
        AVar5 = (*_al_glGetAttribLocation)(GVar3,"al_texcoord");
        shader[1].platform = AVar5;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_use_tex");
        *(GLint *)&shader[1].field_0x1c = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_tex");
        *(GLint *)&shader[1].vt = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_use_tex_matrix");
        *(GLint *)((long)&shader[1].vt + 4) = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_tex_matrix");
        *(GLint *)&shader[1].bitmaps._itemsize = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_alpha_test");
        *(GLint *)((long)&shader[1].bitmaps._itemsize + 4) = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_alpha_func");
        *(GLint *)&shader[1].bitmaps._items = GVar4;
        GVar4 = (*_al_glGetUniformLocation)(GVar3,"al_alpha_test_val");
        *(GLint *)((long)&shader[1].bitmaps._items + 4) = GVar4;
        for (uVar7 = 0; uVar7 != 10; uVar7 = uVar7 + 1) {
          snprintf(error_buf,0x11,"al_user_attr_%d",uVar7 & 0xffffffff);
          GVar4 = (*_al_glGetAttribLocation)(GVar3,error_buf);
          *(GLint *)((long)&shader[1].bitmaps._size + uVar7 * 4) = GVar4;
        }
        check_gl_error("glGetAttribLocation, glGetUniformLocation");
        return true;
      }
      (*_al_glGetProgramInfoLog)(GVar3,0x1000,(GLsizei *)0x0,error_buf);
      if (shader->log == (ALLEGRO_USTR *)0x0) {
        pAVar6 = al_ustr_new(error_buf);
        shader->log = pAVar6;
      }
      else {
        al_ustr_truncate(shader->log,0);
        al_ustr_append_cstr(shader->log,error_buf);
      }
      _Var2 = _al_trace_prefix("shader",3,
                               "/workspace/llm4binary/github/license_c_cmakelists/guzmandrade[P]allegro5/src/opengl/ogl_shader.c"
                               ,0xb8,"glsl_build_shader");
      if (_Var2) {
        _al_trace_suffix("Link error: %s\n",error_buf);
      }
      (*_al_glDeleteProgram)(*(GLuint *)&shader[1].pixel_copy);
    }
  }
  return false;
}

Assistant:

static bool glsl_build_shader(ALLEGRO_SHADER *shader)
{
   GLint status;
   ALLEGRO_SHADER_GLSL_S *gl_shader = (ALLEGRO_SHADER_GLSL_S *)shader;
   GLchar error_buf[4096];

   if (gl_shader->vertex_shader == 0 && gl_shader->pixel_shader == 0)
      return false;

   if (gl_shader->program_object != 0) {
      glDeleteProgram(gl_shader->program_object);
   }

   gl_shader->program_object = glCreateProgram();
   if (gl_shader->program_object == 0)
      return false;

   if (gl_shader->vertex_shader)
      glAttachShader(gl_shader->program_object, gl_shader->vertex_shader);
   if (gl_shader->pixel_shader)
      glAttachShader(gl_shader->program_object, gl_shader->pixel_shader);

   glLinkProgram(gl_shader->program_object);

   glGetProgramiv(gl_shader->program_object, GL_LINK_STATUS, &status);

   if (status == 0) {
      glGetProgramInfoLog(gl_shader->program_object, sizeof(error_buf), NULL,
         error_buf);
      if (shader->log) {
         al_ustr_truncate(shader->log, 0);
         al_ustr_append_cstr(shader->log, error_buf);
      }
      else {
         shader->log = al_ustr_new(error_buf);
      }
      ALLEGRO_ERROR("Link error: %s\n", error_buf);
      glDeleteProgram(gl_shader->program_object);
      return false;
   }

   /* Look up variable locations. */
   lookup_varlocs(&gl_shader->varlocs, gl_shader->program_object);

   return true;
}